

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

OutputInfo * __thiscall cmTarget::GetOutputInfo(cmTarget *this,string *config)

{
  bool bVar1;
  TargetType targetType;
  string *psVar2;
  char *pcVar3;
  cmMakefile *this_00;
  ulong uVar4;
  cmTargetInternals *pcVar5;
  pointer ppVar6;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_OutputInfo>_&>::value,_pair<iterator,_bool>_>
  _Var7;
  iterator local_1d8;
  undefined1 local_1d0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>
  local_1c8;
  undefined1 local_1c0 [8];
  value_type entry;
  string local_138;
  undefined1 local_118 [8];
  OutputInfo info;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>
  local_b0;
  iterator local_a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>
  local_a0;
  const_iterator i;
  undefined1 local_78 [8];
  string config_upper;
  allocator local_41;
  undefined1 local_40 [8];
  string msg;
  string *config_local;
  cmTarget *this_local;
  
  msg.field_2._8_8_ = config;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmTarget *)0x0;
  }
  else {
    bVar1 = HaveWellDefinedOutputFiles(this);
    if (bVar1) {
      std::__cxx11::string::string((string *)local_78);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        cmsys::SystemTools::UpperCase((string *)&i,(string *)msg.field_2._8_8_);
        std::__cxx11::string::operator=((string *)local_78,(string *)&i);
        std::__cxx11::string::~string((string *)&i);
      }
      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>_>
           ::find(&pcVar5->OutputInfoMap,(key_type *)local_78);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>
      ::_Rb_tree_const_iterator(&local_a0,&local_a8);
      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
      info.PdbDir.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>_>
           ::end(&pcVar5->OutputInfoMap);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>
      ::_Rb_tree_const_iterator(&local_b0,(iterator *)((long)&info.PdbDir.field_2 + 8));
      bVar1 = std::operator==(&local_a0,&local_b0);
      if (bVar1) {
        OutputInfo::OutputInfo((OutputInfo *)local_118);
        ComputeOutputDir(this,(string *)msg.field_2._8_8_,false,(string *)local_118);
        ComputeOutputDir(this,(string *)msg.field_2._8_8_,true,
                         (string *)((long)&info.OutDir.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_138,"PDB",
                   (allocator *)(entry.second.PdbDir.field_2._M_local_buf + 0xf));
        bVar1 = ComputePDBOutputDir(this,&local_138,(string *)msg.field_2._8_8_,
                                    (string *)((long)&info.ImpDir.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(entry.second.PdbDir.field_2._M_local_buf + 0xf));
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          std::__cxx11::string::operator=
                    ((string *)(info.ImpDir.field_2._M_local_buf + 8),(string *)local_118);
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget::OutputInfo_&,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
                    *)local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   (OutputInfo *)local_118);
        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
        _Var7 = std::
                map<std::__cxx11::string,cmTarget::OutputInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>>>
                ::insert<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>&>
                          ((map<std::__cxx11::string,cmTarget::OutputInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>>>
                            *)&pcVar5->OutputInfoMap,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
                            *)local_1c0);
        local_1d8._M_node = (_Base_ptr)_Var7.first._M_node;
        local_1d0 = _Var7.second;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>
        ::_Rb_tree_const_iterator(&local_1c8,&local_1d8);
        local_a0._M_node = local_1c8._M_node;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
                 *)local_1c0);
        OutputInfo::~OutputInfo((OutputInfo *)local_118);
      }
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>
               ::operator->(&local_a0);
      this_local = (cmTarget *)&ppVar6->second;
      std::__cxx11::string::~string((string *)local_78);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_40,"cmTarget::GetOutputInfo called for ",&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      psVar2 = GetName_abi_cxx11_(this);
      std::__cxx11::string::operator+=((string *)local_40,(string *)psVar2);
      std::__cxx11::string::operator+=((string *)local_40," which has type ");
      targetType = GetType(this);
      pcVar3 = GetTargetTypeName(targetType);
      std::__cxx11::string::operator+=((string *)local_40,pcVar3);
      this_00 = GetMakefile(this);
      cmMakefile::IssueMessage(this_00,INTERNAL_ERROR,(string *)local_40);
      this_local = (cmTarget *)0x0;
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  return (OutputInfo *)this_local;
}

Assistant:

cmTarget::OutputInfo const* cmTarget::GetOutputInfo(
    const std::string& config) const
{
  // There is no output information for imported targets.
  if(this->IsImported())
    {
    return 0;
    }

  // Only libraries and executables have well-defined output files.
  if(!this->HaveWellDefinedOutputFiles())
    {
    std::string msg = "cmTarget::GetOutputInfo called for ";
    msg += this->GetName();
    msg += " which has type ";
    msg += cmTarget::GetTargetTypeName(this->GetType());
    this->GetMakefile()->IssueMessage(cmake::INTERNAL_ERROR, msg);
    return 0;
    }

  // Lookup/compute/cache the output information for this configuration.
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }
  typedef cmTargetInternals::OutputInfoMapType OutputInfoMapType;
  OutputInfoMapType::const_iterator i =
    this->Internal->OutputInfoMap.find(config_upper);
  if(i == this->Internal->OutputInfoMap.end())
    {
    OutputInfo info;
    this->ComputeOutputDir(config, false, info.OutDir);
    this->ComputeOutputDir(config, true, info.ImpDir);
    if(!this->ComputePDBOutputDir("PDB", config, info.PdbDir))
      {
      info.PdbDir = info.OutDir;
      }
    OutputInfoMapType::value_type entry(config_upper, info);
    i = this->Internal->OutputInfoMap.insert(entry).first;
    }
  return &i->second;
}